

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O3

bool __thiscall Gluco::SimpSolver::eliminate(SimpSolver *this,bool turn_off_elim)

{
  char cVar1;
  char *pcVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  Heap<Gluco::SimpSolver::ElimLt> *local_48;
  
  bVar5 = Solver::simplify(&this->super_Solver);
  if (!bVar5) {
    return false;
  }
  if (this->use_simplification != true) {
    return true;
  }
  if ((this->super_Solver).clauses.sz < 0x493e01) {
LAB_005ccbdb:
    if (((this->n_touched < 1) && ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) &&
       ((this->elim_heap).heap.sz < 1)) goto LAB_005cce9f;
    gatherTouchedClauses(this);
    iVar7 = (this->subsumption_queue).end;
    iVar10 = 0;
    iVar8 = (this->subsumption_queue).first;
    iVar6 = iVar7 - iVar8;
    if (iVar7 < iVar8) {
      iVar10 = (this->subsumption_queue).buf.sz;
    }
    iVar7 = iVar6 + iVar10;
    if (((iVar7 != 0 && SCARRY4(iVar6,iVar10) == iVar7 < 0) ||
        (this->bwdsub_assigns < (this->super_Solver).trail.sz)) &&
       (bVar5 = backwardSubsumptionCheck(this,true), !bVar5)) {
LAB_005cce12:
      (this->super_Solver).ok = false;
      goto LAB_005cce9f;
    }
    if ((this->super_Solver).asynch_interrupt == false) goto code_r0x005ccc51;
    if (this->bwdsub_assigns != (this->super_Solver).trail.sz) {
      __assert_fail("bwdsub_assigns == trail.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                    ,0x27d,"bool Gluco::SimpSolver::eliminate(bool)");
    }
    iVar7 = (this->subsumption_queue).end;
    iVar10 = 0;
    iVar8 = (this->subsumption_queue).first;
    if (iVar7 < iVar8) {
      iVar10 = (this->subsumption_queue).buf.sz;
    }
    if ((iVar7 - iVar8) + iVar10 != 0) {
      __assert_fail("subsumption_queue.size() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                    ,0x27e,"bool Gluco::SimpSolver::eliminate(bool)");
    }
    if (this->n_touched != 0) {
      __assert_fail("n_touched == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                    ,0x27f,"bool Gluco::SimpSolver::eliminate(bool)");
    }
    piVar4 = (this->elim_heap).heap.data;
    if (0 < (this->elim_heap).heap.sz) {
      piVar3 = (this->elim_heap).indices.data;
      lVar9 = 0;
      do {
        piVar3[piVar4[lVar9]] = -1;
        lVar9 = lVar9 + 1;
      } while (lVar9 < (this->elim_heap).heap.sz);
LAB_005cce95:
      (this->elim_heap).heap.sz = 0;
      goto LAB_005cce9f;
    }
    if (piVar4 != (int *)0x0) goto LAB_005cce95;
    goto LAB_005cce9f;
  }
  puts("c Too many clauses... No preprocessing");
LAB_005cce9f:
  local_48 = &this->elim_heap;
  if (turn_off_elim) {
    pcVar2 = (this->touched).data;
    if (pcVar2 != (char *)0x0) {
      (this->touched).sz = 0;
      free(pcVar2);
      (this->touched).data = (char *)0x0;
      (this->touched).cap = 0;
    }
    OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clear
              (&this->occurs,true);
    piVar4 = (this->n_occ).data;
    if (piVar4 != (int *)0x0) {
      (this->n_occ).sz = 0;
      free(piVar4);
      (this->n_occ).data = (int *)0x0;
      (this->n_occ).cap = 0;
    }
    Heap<Gluco::SimpSolver::ElimLt>::clear(local_48,true);
    Queue<unsigned_int>::clear(&this->subsumption_queue,true);
    this->use_simplification = false;
    (this->super_Solver).remove_satisfied = true;
    (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 = 0;
    Solver::rebuildOrderHeap(&this->super_Solver);
  }
  else {
    cleanUpClauses(this);
    if ((double)(this->super_Solver).ca.super_RegionAllocator<unsigned_int>.wasted_ <=
        (double)(this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz *
        (this->super_Solver).garbage_frac) goto LAB_005ccf88;
  }
  (*(this->super_Solver)._vptr_Solver[3])(this);
LAB_005ccf88:
  if ((0 < (this->super_Solver).verbosity) && (lVar9 = (long)(this->elimclauses).sz, 0 < lVar9)) {
    printf("c |  Eliminated clauses:     %10.2f Mb                                                                |\n"
           ,(double)(lVar9 << 2) * 9.5367431640625e-07);
  }
  return (this->super_Solver).ok;
code_r0x005ccc51:
  if ((this->elim_heap).heap.sz != 0) {
    iVar7 = 0;
    uVar11 = 0;
    do {
      iVar8 = Heap<Gluco::SimpSolver::ElimLt>::removeMin(&this->elim_heap);
      if ((this->super_Solver).asynch_interrupt != false) break;
      if ((((this->eliminated).sz < 1) || ((this->eliminated).data[iVar8] == '\0')) &&
         (((this->super_Solver).assigns.data[iVar8].value & 2) != 0)) {
        if ((1 < (this->super_Solver).verbosity) && ((int)(uVar11 / 100) * 100 + iVar7 == 0)) {
          printf("elimination left: %10d\r",(ulong)(uint)(this->elim_heap).heap.sz);
        }
        if (this->use_asymm == true) {
          pcVar2 = (this->frozen).data;
          cVar1 = pcVar2[iVar8];
          pcVar2[iVar8] = '\x01';
          bVar5 = asymmVar(this,iVar8);
          if (!bVar5) {
            (this->super_Solver).ok = false;
            goto LAB_005cce9f;
          }
          (this->frozen).data[iVar8] = cVar1 != '\0';
        }
        if ((((this->use_elim == true) &&
             (((this->super_Solver).assigns.data[iVar8].value & 2) != 0)) &&
            ((this->frozen).data[iVar8] == '\0')) && (bVar5 = eliminateVar(this,iVar8), !bVar5))
        goto LAB_005cce12;
        if ((double)(this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz *
            this->simp_garbage_frac <
            (double)(this->super_Solver).ca.super_RegionAllocator<unsigned_int>.wasted_) {
          (*(this->super_Solver)._vptr_Solver[3])(this);
        }
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      iVar7 = iVar7 + -1;
    } while ((this->elim_heap).heap.sz != 0);
  }
  iVar7 = (this->subsumption_queue).end;
  iVar10 = 0;
  iVar8 = (this->subsumption_queue).first;
  if (iVar7 < iVar8) {
    iVar10 = (this->subsumption_queue).buf.sz;
  }
  if ((iVar7 - iVar8) + iVar10 != 0) {
    __assert_fail("subsumption_queue.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,0x29e,"bool Gluco::SimpSolver::eliminate(bool)");
  }
  goto LAB_005ccbdb;
}

Assistant:

bool SimpSolver::eliminate(bool turn_off_elim)
{
    //abctime clk = Abc_Clock();
    if (!simplify())
        return false;
    else if (!use_simplification)
        return true;

    // Main simplification loop:
    //

    int toPerform = clauses.size()<=4800000;
    
    if(!toPerform) {
      printf("c Too many clauses... No preprocessing\n");
    }

    while (toPerform && (n_touched > 0 || bwdsub_assigns < trail.size() || elim_heap.size() > 0)){

        gatherTouchedClauses();
        // printf("  ## (time = %6.2f s) BWD-SUB: queue = %d, trail = %d\n", cpuTime(), subsumption_queue.size(), trail.size() - bwdsub_assigns);
        if ((subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()) && 
            !backwardSubsumptionCheck(true)){
            ok = false; goto cleanup; }

        // Empty elim_heap and return immediately on user-interrupt:
        if (asynch_interrupt){
            assert(bwdsub_assigns == trail.size());
            assert(subsumption_queue.size() == 0);
            assert(n_touched == 0);
            elim_heap.clear();
            goto cleanup; }

        // printf("  ## (time = %6.2f s) ELIM: vars = %d\n", cpuTime(), elim_heap.size());
        for (int cnt = 0; !elim_heap.empty(); cnt++){
            Var elim = elim_heap.removeMin();
            
            if (asynch_interrupt) break;

            if (isEliminated(elim) || value(elim) != l_Undef) continue;

            if (verbosity >= 2 && cnt % 100 == 0)
                printf("elimination left: %10d\r", elim_heap.size());

            if (use_asymm){
                // Temporarily freeze variable. Otherwise, it would immediately end up on the queue again:
                bool was_frozen = frozen[elim] != 0;
                frozen[elim] = true;
                if (!asymmVar(elim)){
                    ok = false; goto cleanup; }
                frozen[elim] = was_frozen; }

            // At this point, the variable may have been set by assymetric branching, so check it
            // again. Also, don't eliminate frozen variables:
            if (use_elim && value(elim) == l_Undef && !frozen[elim] && !eliminateVar(elim)){
                ok = false; goto cleanup; }

            checkGarbage(simp_garbage_frac);
        }

        assert(subsumption_queue.size() == 0);
    }
 cleanup:

    // If no more simplification is needed, free all simplification-related data structures:
    if (turn_off_elim){
        touched  .clear(true);
        occurs   .clear(true);
        n_occ    .clear(true);
        elim_heap.clear(true);
        subsumption_queue.clear(true);

        use_simplification    = false;
        remove_satisfied      = true;
        ca.extra_clause_field = false;

        // Force full cleanup (this is safe and desirable since it only happens once):
        rebuildOrderHeap();
        garbageCollect();
    }else{
        // Cheaper cleanup:
        cleanUpClauses(); // TODO: can we make 'cleanUpClauses()' not be linear in the problem size somehow?
        checkGarbage();
    }

    if (verbosity >= 1 && elimclauses.size() > 0)
        printf("c |  Eliminated clauses:     %10.2f Mb                                                                |\n", 
               double(elimclauses.size() * sizeof(uint32_t)) / (1024*1024));
    return ok;
}